

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O2

void __thiscall vera::Vbo::printInfo(Vbo *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Vertices  = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_nVertices);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Indices   = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_nIndices);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (this->m_vertexLayout != (VertexLayout *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Vertex Layout:");
    std::endl<char,std::char_traits<char>>(poVar1);
    VertexLayout::printAttrib(this->m_vertexLayout);
    return;
  }
  return;
}

Assistant:

void Vbo::printInfo() {
    std::cout << "Vertices  = " << m_nVertices << std::endl;
    std::cout << "Indices   = " << m_nIndices << std::endl;
    if (m_vertexLayout) {
        std::cout << "Vertex Layout:" << std::endl;
        m_vertexLayout->printAttrib();
    }
}